

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCollisionAlgorithmsBullet.cpp
# Opt level: O3

void __thiscall
chrono::collision::cbtSphereCylinderCollisionAlgorithm::getAllContactManifolds
          (cbtSphereCylinderCollisionAlgorithm *this,cbtManifoldArray *manifoldArray)

{
  uint uVar1;
  cbtPersistentManifold **ppcVar2;
  cbtPersistentManifold *pcVar3;
  ulong uVar4;
  int iVar5;
  
  pcVar3 = this->m_manifoldPtr;
  if ((pcVar3 != (cbtPersistentManifold *)0x0) && (this->m_ownManifold == true)) {
    uVar1 = manifoldArray->m_size;
    if (uVar1 == manifoldArray->m_capacity) {
      iVar5 = 1;
      if (uVar1 != 0) {
        iVar5 = uVar1 * 2;
      }
      if ((int)uVar1 < iVar5) {
        if (iVar5 == 0) {
          ppcVar2 = (cbtPersistentManifold **)0x0;
        }
        else {
          ppcVar2 = (cbtPersistentManifold **)cbtAlignedAllocInternal((long)iVar5 << 3,0x10);
          uVar1 = manifoldArray->m_size;
        }
        if (0 < (int)uVar1) {
          uVar4 = 0;
          do {
            ppcVar2[uVar4] = manifoldArray->m_data[uVar4];
            uVar4 = uVar4 + 1;
          } while (uVar1 != uVar4);
        }
        if ((manifoldArray->m_data != (cbtPersistentManifold **)0x0) &&
           (manifoldArray->m_ownsMemory == true)) {
          cbtAlignedFreeInternal(manifoldArray->m_data);
          uVar1 = manifoldArray->m_size;
        }
        manifoldArray->m_ownsMemory = true;
        manifoldArray->m_data = ppcVar2;
        manifoldArray->m_capacity = iVar5;
        pcVar3 = this->m_manifoldPtr;
      }
    }
    manifoldArray->m_data[(int)uVar1] = pcVar3;
    manifoldArray->m_size = uVar1 + 1;
  }
  return;
}

Assistant:

void cbtSphereCylinderCollisionAlgorithm::getAllContactManifolds(cbtManifoldArray& manifoldArray) {
    if (m_manifoldPtr && m_ownManifold) {
        manifoldArray.push_back(m_manifoldPtr);
    }
}